

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O2

CURLcode curl_easy_recv(CURL *curl,void *buffer,size_t buflen,size_t *n)

{
  CURLcode CVar1;
  curl_socket_t sfd;
  connectdata *c;
  ssize_t n1;
  curl_socket_t local_2c;
  connectdata *local_28;
  size_t local_20;
  
  CVar1 = easy_connection((SessionHandle *)curl,&local_2c,&local_28);
  if (CVar1 == CURLE_OK) {
    *n = 0;
    CVar1 = Curl_read(local_28,local_2c,(char *)buffer,buflen,(ssize_t *)&local_20);
    if (CVar1 == CURLE_OK) {
      *n = local_20;
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

CURLcode curl_easy_recv(CURL *curl, void *buffer, size_t buflen, size_t *n)
{
  curl_socket_t sfd;
  CURLcode ret;
  ssize_t n1;
  struct connectdata *c;
  struct SessionHandle *data = (struct SessionHandle *)curl;

  ret = easy_connection(data, &sfd, &c);
  if(ret)
    return ret;

  *n = 0;
  ret = Curl_read(c, sfd, buffer, buflen, &n1);

  if(ret != CURLE_OK)
    return ret;

  *n = (size_t)n1;

  return CURLE_OK;
}